

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall Js::ScriptContext::InternalClose(ScriptContext *this)

{
  uint *puVar1;
  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
  *this_00;
  SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  RuntimeContextInfo *this_01;
  ScriptContextTTD *this_02;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar3;
  Type pcVar4;
  long lVar5;
  long *plVar6;
  FunctionBody *this_03;
  ProbeContainer *this_04;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_05;
  Type pSVar7;
  JavascriptLibrary *this_06;
  code *pcVar8;
  bool bVar9;
  undefined4 *puVar10;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar11;
  ScriptContext *pSVar12;
  long lVar13;
  long lVar14;
  Type buffer;
  CriticalSection *this_07;
  int iVar15;
  ulong uVar16;
  
  this->isScriptContextActuallyClosed = true;
  puVar1 = &this->threadContext->closedScriptContextCount;
  *puVar1 = *puVar1 + 1;
  if (DAT_015d3464 == '\x01') {
    Output::Print(L"MemoryTrace: ScriptContext Close\n");
    Output::Flush();
  }
  this_01 = this->TTDWellKnownInfo;
  if (this_01 != (RuntimeContextInfo *)0x0) {
    TTD::RuntimeContextInfo::~RuntimeContextInfo(this_01);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_01,0x170);
    this->TTDWellKnownInfo = (RuntimeContextInfo *)0x0;
  }
  this_02 = this->TTDContextInfo;
  if (this_02 != (ScriptContextTTD *)0x0) {
    TTD::ScriptContextTTD::~ScriptContextTTD(this_02);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_02,0x128);
    this->TTDContextInfo = (ScriptContextTTD *)0x0;
  }
  if (this->nativeCodeGen != (NativeCodeGenerator *)0x0) {
    if ((this->isInitialized == true) &&
       ((this->super_ScriptContextBase).globalObject == (GlobalObject *)0x0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x289,"(!isInitialized || this->globalObject != nullptr)",
                                  "!isInitialized || this->globalObject != nullptr");
      if (!bVar9) goto LAB_007904ba;
      *puVar10 = 0;
    }
    CloseNativeCodeGenerator(this->nativeCodeGen);
  }
  this_07 = &this->threadContext->csFunctionBody;
  CCLock::Enter(&this_07->super_CCLock);
  if ((this->sourceList).ptr !=
      (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
       *)0x0) {
    this_00 = &this->sourceList;
    pLVar11 = Memory::
              RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
              ::operator->(this_00);
    lVar13 = (long)(pLVar11->
                   super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                   ).count;
    if (lVar13 < 1) {
      bVar9 = false;
    }
    else {
      bVar9 = false;
      lVar14 = 0;
      do {
        pRVar3 = (pLVar11->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).buffer.ptr[lVar14].ptr;
        if (((ulong)pRVar3 & 1) == 0 && pRVar3 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0)
        {
          pcVar4 = (pRVar3->super_RecyclerWeakReferenceBase).strongRef;
          if (pcVar4 != (Type)0x0) {
            lVar5 = *(long *)(pcVar4 + 0x18);
            if (lVar5 == 0) {
              bVar9 = false;
            }
            else {
              bVar9 = 0 < *(int *)(lVar5 + 0x20) - *(int *)(lVar5 + 0x28);
            }
          }
          if (bVar9) break;
        }
        lVar14 = lVar14 + 1;
      } while (lVar13 != lVar14);
    }
    if (((bVar9) &&
        (this_00->ptr !=
         (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
          *)0x0)) &&
       (pLVar11 = Memory::
                  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
                  ::operator->(this_00),
       0 < (pLVar11->
           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
           ).count)) {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar13 = 0;
      do {
        pRVar3 = (pLVar11->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).buffer.ptr[lVar13].ptr;
        if (((((ulong)pRVar3 & 1) == 0 && pRVar3 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0
             ) && (pcVar4 = (pRVar3->super_RecyclerWeakReferenceBase).strongRef, pcVar4 != (Type)0x0
                  )) &&
           ((plVar6 = *(long **)(pcVar4 + 0x18), plVar6 != (long *)0x0 &&
            (*(int *)((long)plVar6 + 0x1c) != 0)))) {
          uVar16 = 0;
          do {
            iVar15 = *(int *)(*plVar6 + uVar16 * 4);
            while (iVar15 != -1) {
              lVar14 = (long)iVar15;
              iVar15 = *(int *)(plVar6[1] + 8 + lVar14 * 0x10);
              this_03 = *(FunctionBody **)(plVar6[1] + lVar14 * 0x10);
              if (this_03 == (FunctionBody *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar10 = 1;
                bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                            ,0xa2,"(functionBody)","functionBody");
                if (!bVar9) goto LAB_007904ba;
                *puVar10 = 0;
              }
              pSVar12 = FunctionProxy::GetScriptContext((FunctionProxy *)this_03);
              if ((pSVar12 != (ScriptContext *)0x0) &&
                 (pSVar12 = FunctionProxy::GetScriptContext((FunctionProxy *)this_03),
                 pSVar12 != this)) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar10 = 1;
                bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                            ,0x2b8,
                                            "(functionBody->GetScriptContext() == nullptr || functionBody->GetScriptContext() == this)"
                                            ,
                                            "functionBody->GetScriptContext() == nullptr || functionBody->GetScriptContext() == this"
                                           );
                if (!bVar9) goto LAB_007904ba;
                *puVar10 = 0;
              }
              FunctionBody::Cleanup(this_03,true);
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 < *(uint *)((long)plVar6 + 0x1c));
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < (pLVar11->
                        super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                        ).count);
    }
  }
  CCLock::Leave(&this_07->super_CCLock);
  ThreadContext::SubSourceSize(this->threadContext,this->sourceSize);
  if (this->interpreterThunkEmitter != (InterpreterThunkEmitter *)0x0) {
    InterpreterThunkEmitter::Close(this->interpreterThunkEmitter);
  }
  if (this->asmJsInterpreterThunkEmitter != (InterpreterThunkEmitter *)0x0) {
    InterpreterThunkEmitter::Close(this->asmJsInterpreterThunkEmitter);
  }
  if (this->m_remoteScriptContextAddr != (PSCRIPTCONTEXT_HANDLE)0x0) {
    JITManager::CloseScriptContext
              ((JITManager *)&JITManager::s_jitManager,this->m_remoteScriptContextAddr);
  }
  EnsureClearDebugDocument(this);
  if (this->debugContext != (DebugContext *)0x0) {
    this_04 = this->debugContext->diagProbesContainer;
    if (this_04 != (ProbeContainer *)0x0) {
      ProbeContainer::UninstallInlineBreakpointProbe(this_04,(HaltCallback *)0x0);
      ProbeContainer::UninstallDebuggerScriptOptionCallback(this->debugContext->diagProbesContainer)
      ;
    }
    CCLock::Enter(&(this->debugContextCloseCS).super_CCLock);
    DebugContext::Close(this->debugContext);
    CCLock::Leave(&(this->debugContextCloseCS).super_CCLock);
  }
  this_05 = &this->diagnosticArena->
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  if (this_05 != (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)0x0) {
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
              (this_05);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_05,0x80);
    this->diagnosticArena = (ArenaAllocator *)0x0;
  }
  bVar9 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,ProfileFlag);
  if (bVar9) {
    if (this->isProfilerCreated == true) {
      ProfilePrint(this);
    }
    if (this->profiler != (ScriptContextProfiler *)0x0) {
      ScriptContextProfiler::Release(this->profiler);
      this->profiler = (ScriptContextProfiler *)0x0;
    }
  }
  if (this->referencesSharedDynamicSourceContextInfo == true) {
    if ((((this->super_ScriptContextBase).javascriptLibrary)->cache).dynamicSourceContextInfoMap.ptr
        == (BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x310,"(this->GetDynamicSourceContextInfoMap() != nullptr)",
                                  "this->GetDynamicSourceContextInfoMap() != nullptr");
      if (!bVar9) {
LAB_007904ba:
        pcVar8 = (code *)invalidInstructionException();
        (*pcVar8)();
      }
      *puVar10 = 0;
    }
    ThreadContext::ReleaseSourceDynamicProfileManagers(this->threadContext,this->url);
  }
  if (this->interpreterArena != (ArenaAllocator *)0x0) {
    ReleaseInterpreterArena(this);
    this->interpreterArena = (ArenaAllocator *)0x0;
  }
  this->builtInLibraryFunctions = (BuiltInLibraryFunctionMap *)0x0;
  (this->super_ScriptContextBase).pActiveScriptDirect = (IActiveScriptDirect *)0x0;
  this->isWeakReferenceDictionaryListCleared = true;
  pSVar2 = &this->weakReferenceDictionaryList;
  buffer = (this->weakReferenceDictionaryList).super_SListNodeBase<Memory::ArenaAllocator>.next;
  if ((SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount> *)buffer !=
      pSVar2) {
    do {
      pSVar7 = buffer->next;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                (&(this->generalAllocator).
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,buffer,
                 0x10);
      buffer = pSVar7;
    } while ((SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount> *)
             pSVar7 != pSVar2);
  }
  (this->weakReferenceDictionaryList).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &pSVar2->super_SListNodeBase<Memory::ArenaAllocator>;
  (this->weakReferenceDictionaryList).super_RealCount.count = 0;
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::Clear
            (&this->noSpecialPropertyRegistry,false);
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::Clear
            (&this->onlyWritablePropertyRegistry,false);
  ThreadContext::ReleaseDebugManager(this->threadContext);
  this_06 = (this->super_ScriptContextBase).javascriptLibrary;
  if (this_06 == (JavascriptLibrary *)0x0) {
    return;
  }
  JavascriptLibrary::CleanupForClose(this_06);
  JavascriptLibrary::Uninitialize((this->super_ScriptContextBase).javascriptLibrary);
  ClearScriptContextCaches(this);
  return;
}

Assistant:

void ScriptContext::InternalClose()
    {
        isScriptContextActuallyClosed = true;
        this->GetThreadContext()->closedScriptContextCount++;

        PERF_COUNTER_DEC(Basic, ScriptContextActive);

#if DBG_DUMP
        if (Js::Configuration::Global.flags.TraceWin8Allocations)
        {
            Output::Print(_u("MemoryTrace: ScriptContext Close\n"));
            Output::Flush();
        }
#endif
        JS_ETW_INTERNAL(EventWriteJSCRIPT_HOST_SCRIPT_CONTEXT_CLOSE(this));

#if ENABLE_TTD
        if(this->TTDWellKnownInfo != nullptr)
        {
            TT_HEAP_DELETE(TTD::RuntimeContextInfo, this->TTDWellKnownInfo);
            this->TTDWellKnownInfo = nullptr;
        }

        if(this->TTDContextInfo != nullptr)
        {
            TT_HEAP_DELETE(TTD::ScriptContextTTD, this->TTDContextInfo);
            this->TTDContextInfo = nullptr;
        }
#endif

#if ENABLE_NATIVE_CODEGEN
        if (nativeCodeGen != nullptr)
        {
            Assert(!isInitialized || this->globalObject != nullptr);
            CloseNativeCodeGenerator(this->nativeCodeGen);
        }
#endif
        {
            // Take lock on the function bodies to sync with the etw source rundown if any.
            AutoCriticalSection autocs(GetThreadContext()->GetFunctionBodyLock());
            if (this->sourceList)
            {
                bool hasFunctions = false;
                this->sourceList->MapUntil([&hasFunctions](int, RecyclerWeakReference<Utf8SourceInfo>* sourceInfoWeakRef) -> bool
                {
                    Utf8SourceInfo* sourceInfo = sourceInfoWeakRef->Get();
                    if (sourceInfo)
                    {
                        hasFunctions = sourceInfo->HasFunctions();
                    }

                    return hasFunctions;
                });

                if (hasFunctions)
                {
#if ENABLE_NATIVE_CODEGEN
#if PDATA_ENABLED && defined(_WIN32)
                    struct AutoReset
                    {
                        AutoReset(ThreadContext* threadContext)
                            :threadContext(threadContext)
                        {
                            // indicate background thread that we need help to delete the xData
                            threadContext->GetJobProcessor()->StartExtraWork();
                        }
                        ~AutoReset()
                        {
                            threadContext->GetJobProcessor()->EndExtraWork();
                        }

                        ThreadContext* threadContext;
                    } autoReset(this->GetThreadContext());
#endif
#endif

                    // We still need to walk through all the function bodies and call cleanup
                    // because otherwise ETW events might not get fired if a GC doesn't happen
                    // and the thread context isn't shut down cleanly (process detach case)
                    this->MapFunction([this](Js::FunctionBody* functionBody) {
                        Assert(functionBody->GetScriptContext() == nullptr || functionBody->GetScriptContext() == this);
                        functionBody->Cleanup(/* isScriptContextClosing */ true);
                    });
                }
            }
        }

        this->GetThreadContext()->SubSourceSize(this->GetSourceSize());

#if DYNAMIC_INTERPRETER_THUNK
        if (this->interpreterThunkEmitter != nullptr)
        {
            this->interpreterThunkEmitter->Close();
        }
#endif

#ifdef ASMJS_PLAT
        if (this->asmJsInterpreterThunkEmitter != nullptr)
        {
            this->asmJsInterpreterThunkEmitter->Close();
        }
#endif

#if ENABLE_NATIVE_CODEGEN
        if (m_remoteScriptContextAddr)
        {
            JITManager::GetJITManager()->CloseScriptContext(m_remoteScriptContextAddr);
        }
#endif

#ifdef ENABLE_SCRIPT_PROFILING
        // Stop profiling if present
        DeRegisterProfileProbe(S_OK, nullptr);
#endif

#ifdef ENABLE_SCRIPT_DEBUGGING
        this->EnsureClearDebugDocument();

        if (this->debugContext != nullptr)
        {
            if (this->debugContext->GetProbeContainer() != nullptr)
            {
                this->debugContext->GetProbeContainer()->UninstallInlineBreakpointProbe(nullptr);
                this->debugContext->GetProbeContainer()->UninstallDebuggerScriptOptionCallback();
            }

            // Guard the closing DebugContext as in meantime PDM might call OnBreakFlagChange
            AutoCriticalSection autoDebugContextCloseCS(&debugContextCloseCS);
            this->debugContext->Close();
            // Not deleting debugContext here as Close above will clear all memory debugContext allocated.
            // Actual deletion of debugContext will happen in ScriptContext destructor
        }

        if (this->diagnosticArena != nullptr)
        {
            HeapDelete(this->diagnosticArena);
            this->diagnosticArena = nullptr;
        }
#endif

        // Need to print this out before the native code gen is deleted
        // which will delete the codegenProfiler

#ifdef PROFILE_EXEC
        if (Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag))
        {
            if (isProfilerCreated)
            {
                this->ProfilePrint();
            }

            if (profiler != nullptr)
            {
                profiler->Release();
                profiler = nullptr;
            }
        }
#endif


#if ENABLE_PROFILE_INFO
        // Release this only after native code gen is shut down, as there may be
        // profile info allocated from the SourceDynamicProfileManager arena.
        // The first condition might not be true if the dynamic functions have already been freed by the time
        // ScriptContext closes
        if (referencesSharedDynamicSourceContextInfo)
        {
            // For the host provided dynamic code, we may not have added any dynamic context to the dynamicSourceContextInfoMap
            Assert(this->GetDynamicSourceContextInfoMap() != nullptr);
            this->GetThreadContext()->ReleaseSourceDynamicProfileManagers(this->GetUrl());
        }
#endif

        RECYCLER_PERF_COUNTER_SUB(BindReference, bindReferenceCount);

        if (this->interpreterArena)
        {
            ReleaseInterpreterArena();
            interpreterArena = nullptr;
        }

        builtInLibraryFunctions = nullptr;

        pActiveScriptDirect = nullptr;

        isWeakReferenceDictionaryListCleared = true;
        this->weakReferenceDictionaryList.Clear(this->GeneralAllocator());

        this->noSpecialPropertyRegistry.Clear(false /* isThreadClear */);
        this->onlyWritablePropertyRegistry.Clear(false /* isThreadClear */);

#ifdef ENABLE_SCRIPT_DEBUGGING
        threadContext->ReleaseDebugManager();
#endif

        // This can be null if the script context initialization threw
        // and InternalClose gets called in the destructor code path
        if (javascriptLibrary != nullptr)
        {
            javascriptLibrary->CleanupForClose();
            javascriptLibrary->Uninitialize();

            this->ClearScriptContextCaches();
        }
    }